

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O2

PaError PaUtil_InitializeBufferProcessor
                  (PaUtilBufferProcessor *bp,int inputChannelCount,
                  PaSampleFormat userInputSampleFormat,PaSampleFormat hostInputSampleFormat,
                  int outputChannelCount,PaSampleFormat userOutputSampleFormat,
                  PaSampleFormat hostOutputSampleFormat,double sampleRate,PaStreamFlags streamFlags,
                  unsigned_long framesPerUserBuffer,unsigned_long framesPerHostBuffer,
                  PaUtilHostBufferSizeMode hostBufferSizeMode,PaStreamCallback *streamCallback,
                  void *userData)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  PaUtilConverter *pPVar4;
  PaUtilZeroer *pPVar5;
  void *pvVar6;
  void **ppvVar7;
  PaUtilChannelDescriptor *pPVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  size_t sVar12;
  unsigned_long *local_58;
  unsigned_long *local_50;
  
  uVar1 = (ulong)(uint)outputChannelCount;
  if ((streamFlags & 4) != 0) {
    if (framesPerUserBuffer != 0) {
      return -0x270b;
    }
    if (outputChannelCount < 1) {
      return -0x270b;
    }
    if (inputChannelCount < 1) {
      return -0x270b;
    }
    if (streamCallback == (PaStreamCallback *)0x0) {
      return -0x270b;
    }
  }
  bp->tempInputBuffer = (void *)0x0;
  bp->tempInputBufferPtrs = (void **)0x0;
  bp->tempOutputBuffer = (void *)0x0;
  bp->tempOutputBufferPtrs = (void **)0x0;
  bp->framesPerUserBuffer = framesPerUserBuffer;
  bp->framesPerHostBuffer = framesPerHostBuffer;
  bp->inputChannelCount = inputChannelCount;
  bp->outputChannelCount = outputChannelCount;
  bp->hostBufferSizeMode = hostBufferSizeMode;
  bp->hostInputChannels[0] = (PaUtilChannelDescriptor *)0x0;
  bp->hostInputChannels[1] = (PaUtilChannelDescriptor *)0x0;
  bp->hostOutputChannels[0] = (PaUtilChannelDescriptor *)0x0;
  bp->hostOutputChannels[1] = (PaUtilChannelDescriptor *)0x0;
  if (framesPerUserBuffer == 0) {
    bp->useNonAdaptingProcess = 1;
    bp->initialFramesInTempInputBuffer = 0;
    bp->initialFramesInTempOutputBuffer = 0;
    if (hostBufferSizeMode < paUtilUnknownHostBufferSize) {
      bp->framesPerTempBuffer = framesPerHostBuffer;
    }
    else {
      bp->framesPerTempBuffer = 0x400;
    }
LAB_00105bbc:
    uVar3 = 0;
LAB_00105bbe:
    uVar10 = 0;
    uVar11 = uVar3;
LAB_00105bc1:
    bp->framesInTempInputBuffer = uVar10;
    bp->framesInTempOutputBuffer = uVar11;
    if (0 < inputChannelCount) goto LAB_00105bf0;
LAB_00105d13:
    local_50 = &bp->framesInTempOutputBuffer;
    if (outputChannelCount < 1) goto LAB_00105e33;
    uVar2 = Pa_GetSampleSize(hostOutputSampleFormat);
    if (0 < (int)uVar2) {
      bp->bytesPerHostOutputSample = uVar2;
      uVar2 = Pa_GetSampleSize(userOutputSampleFormat);
      if (0 < (int)uVar2) {
        bp->bytesPerUserOutputSample = uVar2;
        pPVar4 = PaUtil_SelectConverter(userOutputSampleFormat,hostOutputSampleFormat,streamFlags);
        bp->outputConverter = pPVar4;
        pPVar5 = PaUtil_SelectZeroer(hostOutputSampleFormat);
        bp->outputZeroer = pPVar5;
        bp->userOutputIsInterleaved = ~(uint)userOutputSampleFormat >> 0x1f;
        bp->hostOutputIsInterleaved = ~(uint)hostOutputSampleFormat >> 0x1f;
        bp->userOutputSampleFormatIsEqualToHost =
             (uint)(((hostOutputSampleFormat ^ userOutputSampleFormat) & 0xffffffff7fffffff) == 0);
        sVar12 = bp->framesPerTempBuffer * uVar1 * (ulong)bp->bytesPerUserOutputSample;
        pvVar6 = (void *)PaUtil_AllocateMemory(sVar12);
        bp->tempOutputBuffer = pvVar6;
        uVar2 = 0xffffd8f8;
        if (pvVar6 != (void *)0x0) {
          if (*local_50 != 0) {
            memset(pvVar6,0,sVar12);
          }
          if ((int)(uint)userOutputSampleFormat < 0) {
            ppvVar7 = (void **)PaUtil_AllocateMemory(uVar1 * 8);
            bp->tempOutputBufferPtrs = ppvVar7;
            if (ppvVar7 == (void **)0x0) goto LAB_00105e90;
          }
          pPVar8 = (PaUtilChannelDescriptor *)PaUtil_AllocateMemory(uVar1 << 5);
          bp->hostOutputChannels[0] = pPVar8;
          if (pPVar8 != (PaUtilChannelDescriptor *)0x0) {
            bp->hostOutputChannels[1] = pPVar8 + uVar1;
LAB_00105e33:
            PaUtil_InitializeTriangularDitherState(&bp->ditherGenerator);
            bp->samplePeriod = 1.0 / sampleRate;
            bp->streamCallback = streamCallback;
            bp->userData = userData;
            return 0;
          }
        }
      }
    }
  }
  else {
    bp->framesPerTempBuffer = framesPerUserBuffer;
    if ((hostBufferSizeMode == paUtilFixedHostBufferSize) &&
       (framesPerHostBuffer % framesPerUserBuffer == 0)) {
      bp->useNonAdaptingProcess = 1;
LAB_00105bb7:
      bp->initialFramesInTempInputBuffer = 0;
      bp->initialFramesInTempOutputBuffer = 0;
      goto LAB_00105bbc;
    }
    bp->useNonAdaptingProcess = 0;
    if (outputChannelCount < 1 || inputChannelCount < 1) goto LAB_00105bb7;
    if (hostBufferSizeMode == paUtilFixedHostBufferSize) {
      uVar10 = framesPerHostBuffer;
      uVar3 = framesPerUserBuffer;
      if (framesPerHostBuffer == 0) {
        __assert_fail("M > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_process.c"
                      ,0x4f,"unsigned long CalculateFrameShift(unsigned long, unsigned long)");
      }
      while (uVar3 != 0) {
        uVar9 = uVar10 % uVar3;
        uVar10 = uVar3;
        uVar3 = uVar9;
      }
      uVar3 = 0;
      for (uVar11 = framesPerHostBuffer;
          uVar11 < (framesPerHostBuffer * framesPerUserBuffer) / uVar10;
          uVar11 = uVar11 + framesPerHostBuffer) {
        if (uVar3 <= uVar11 % framesPerUserBuffer) {
          uVar3 = uVar11 % framesPerUserBuffer;
        }
      }
      if (framesPerUserBuffer <= framesPerHostBuffer) {
        bp->initialFramesInTempInputBuffer = 0;
        bp->initialFramesInTempOutputBuffer = uVar3;
        goto LAB_00105bbe;
      }
      bp->initialFramesInTempInputBuffer = uVar3;
      bp->initialFramesInTempOutputBuffer = 0;
      uVar11 = 0;
      uVar10 = uVar3;
      goto LAB_00105bc1;
    }
    bp->initialFramesInTempInputBuffer = 0;
    bp->initialFramesInTempOutputBuffer = framesPerUserBuffer;
    bp->framesInTempInputBuffer = 0;
    bp->framesInTempOutputBuffer = framesPerUserBuffer;
LAB_00105bf0:
    local_58 = &bp->framesInTempInputBuffer;
    uVar2 = Pa_GetSampleSize(hostInputSampleFormat);
    if (0 < (int)uVar2) {
      bp->bytesPerHostInputSample = uVar2;
      uVar2 = Pa_GetSampleSize(userInputSampleFormat);
      if (0 < (int)uVar2) {
        uVar3 = streamFlags | 2;
        if ((streamFlags & 2) != 0) {
          uVar3 = streamFlags;
        }
        if ((hostInputSampleFormat & 2) == 0) {
          uVar3 = streamFlags;
        }
        bp->bytesPerUserInputSample = uVar2;
        if ((userInputSampleFormat & 4) == 0) {
          uVar3 = streamFlags;
        }
        pPVar4 = PaUtil_SelectConverter(hostInputSampleFormat,userInputSampleFormat,uVar3);
        bp->inputConverter = pPVar4;
        pPVar5 = PaUtil_SelectZeroer(hostInputSampleFormat);
        bp->inputZeroer = pPVar5;
        bp->userInputIsInterleaved = ~(uint)userInputSampleFormat >> 0x1f;
        bp->hostInputIsInterleaved = ~(uint)hostInputSampleFormat >> 0x1f;
        bp->userInputSampleFormatIsEqualToHost =
             (uint)(((hostInputSampleFormat ^ userInputSampleFormat) & 0xffffffff7fffffff) == 0);
        uVar3 = (ulong)(uint)inputChannelCount;
        sVar12 = bp->framesPerTempBuffer * uVar3 * (ulong)bp->bytesPerUserInputSample;
        pvVar6 = (void *)PaUtil_AllocateMemory(sVar12);
        bp->tempInputBuffer = pvVar6;
        if (pvVar6 == (void *)0x0) {
          uVar2 = 0xffffd8f8;
          goto LAB_00105ea1;
        }
        if (*local_58 != 0) {
          memset(pvVar6,0,sVar12);
        }
        if ((int)(uint)userInputSampleFormat < 0) {
          ppvVar7 = (void **)PaUtil_AllocateMemory(uVar3 * 8);
          bp->tempInputBufferPtrs = ppvVar7;
          if (ppvVar7 != (void **)0x0) goto LAB_00105ce8;
        }
        else {
LAB_00105ce8:
          pPVar8 = (PaUtilChannelDescriptor *)PaUtil_AllocateMemory(uVar3 << 5);
          bp->hostInputChannels[0] = pPVar8;
          if (pPVar8 != (PaUtilChannelDescriptor *)0x0) {
            bp->hostInputChannels[1] = pPVar8 + uVar3;
            goto LAB_00105d13;
          }
        }
        uVar2 = 0xffffd8f8;
      }
    }
  }
LAB_00105e90:
  if (bp->tempInputBuffer != (void *)0x0) {
    PaUtil_FreeMemory();
  }
LAB_00105ea1:
  if (bp->tempInputBufferPtrs != (void **)0x0) {
    PaUtil_FreeMemory();
  }
  if (bp->hostInputChannels[0] != (PaUtilChannelDescriptor *)0x0) {
    PaUtil_FreeMemory();
  }
  if (bp->tempOutputBuffer != (void *)0x0) {
    PaUtil_FreeMemory();
  }
  if (bp->tempOutputBufferPtrs != (void **)0x0) {
    PaUtil_FreeMemory();
  }
  if (bp->hostOutputChannels[0] != (PaUtilChannelDescriptor *)0x0) {
    PaUtil_FreeMemory();
  }
  return uVar2;
}

Assistant:

PaError PaUtil_InitializeBufferProcessor( PaUtilBufferProcessor* bp,
        int inputChannelCount, PaSampleFormat userInputSampleFormat,
        PaSampleFormat hostInputSampleFormat,
        int outputChannelCount, PaSampleFormat userOutputSampleFormat,
        PaSampleFormat hostOutputSampleFormat,
        double sampleRate,
        PaStreamFlags streamFlags,
        unsigned long framesPerUserBuffer,
        unsigned long framesPerHostBuffer,
        PaUtilHostBufferSizeMode hostBufferSizeMode,
        PaStreamCallback *streamCallback, void *userData )
{
    PaError result = paNoError;
    PaError bytesPerSample;
    unsigned long tempInputBufferSize, tempOutputBufferSize;
    PaStreamFlags tempInputStreamFlags;

    if( streamFlags & paNeverDropInput )
    {
        /* paNeverDropInput is only valid for full-duplex callback streams, with an unspecified number of frames per buffer. */
        if( !streamCallback || !(inputChannelCount > 0 && outputChannelCount > 0) ||
                framesPerUserBuffer != paFramesPerBufferUnspecified )
            return paInvalidFlag;
    }

    /* initialize buffer ptrs to zero so they can be freed if necessary in error */
    bp->tempInputBuffer = 0;
    bp->tempInputBufferPtrs = 0;
    bp->tempOutputBuffer = 0;
    bp->tempOutputBufferPtrs = 0;

    bp->framesPerUserBuffer = framesPerUserBuffer;
    bp->framesPerHostBuffer = framesPerHostBuffer;

    bp->inputChannelCount = inputChannelCount;
    bp->outputChannelCount = outputChannelCount;

    bp->hostBufferSizeMode = hostBufferSizeMode;

    bp->hostInputChannels[0] = bp->hostInputChannels[1] = 0;
    bp->hostOutputChannels[0] = bp->hostOutputChannels[1] = 0;

    if( framesPerUserBuffer == 0 ) /* streamCallback will accept any buffer size */
    {
        bp->useNonAdaptingProcess = 1;
        bp->initialFramesInTempInputBuffer = 0;
        bp->initialFramesInTempOutputBuffer = 0;

        if( hostBufferSizeMode == paUtilFixedHostBufferSize
                || hostBufferSizeMode == paUtilBoundedHostBufferSize )
        {
            bp->framesPerTempBuffer = framesPerHostBuffer;
        }
        else /* unknown host buffer size */
        {
             bp->framesPerTempBuffer = PA_FRAMES_PER_TEMP_BUFFER_WHEN_HOST_BUFFER_SIZE_IS_UNKNOWN_;
        }
    }
    else
    {
        bp->framesPerTempBuffer = framesPerUserBuffer;

        if( hostBufferSizeMode == paUtilFixedHostBufferSize
                && framesPerHostBuffer % framesPerUserBuffer == 0 )
        {
            bp->useNonAdaptingProcess = 1;
            bp->initialFramesInTempInputBuffer = 0;
            bp->initialFramesInTempOutputBuffer = 0;
        }
        else
        {
            bp->useNonAdaptingProcess = 0;

            if( inputChannelCount > 0 && outputChannelCount > 0 )
            {
                /* full duplex */
                if( hostBufferSizeMode == paUtilFixedHostBufferSize )
                {
                    unsigned long frameShift =
                        CalculateFrameShift( framesPerHostBuffer, framesPerUserBuffer );

                    if( framesPerUserBuffer > framesPerHostBuffer )
                    {
                        bp->initialFramesInTempInputBuffer = frameShift;
                        bp->initialFramesInTempOutputBuffer = 0;
                    }
                    else
                    {
                        bp->initialFramesInTempInputBuffer = 0;
                        bp->initialFramesInTempOutputBuffer = frameShift;
                    }
                }
                else /* variable host buffer size, add framesPerUserBuffer latency */
                {
                    bp->initialFramesInTempInputBuffer = 0;
                    bp->initialFramesInTempOutputBuffer = framesPerUserBuffer;
                }
            }
            else
            {
                /* half duplex */
                bp->initialFramesInTempInputBuffer = 0;
                bp->initialFramesInTempOutputBuffer = 0;
            }
        }
    }


    bp->framesInTempInputBuffer = bp->initialFramesInTempInputBuffer;
    bp->framesInTempOutputBuffer = bp->initialFramesInTempOutputBuffer;

    
    if( inputChannelCount > 0 )
    {
        bytesPerSample = Pa_GetSampleSize( hostInputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerHostInputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        bytesPerSample = Pa_GetSampleSize( userInputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerUserInputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        /* Under the assumption that no ADC in existence delivers better than 24bits resolution,
            we disable dithering when host input format is paInt32 and user format is paInt24, 
            since the host samples will just be padded with zeros anyway. */

        tempInputStreamFlags = streamFlags;
        if( !(tempInputStreamFlags & paDitherOff) /* dither is on */
                && (hostInputSampleFormat & paInt32) /* host input format is int32 */
                && (userInputSampleFormat & paInt24) /* user requested format is int24 */ ){

            tempInputStreamFlags = tempInputStreamFlags | paDitherOff;
        }

        bp->inputConverter =
            PaUtil_SelectConverter( hostInputSampleFormat, userInputSampleFormat, tempInputStreamFlags );

        bp->inputZeroer = PaUtil_SelectZeroer( hostInputSampleFormat );
            
        bp->userInputIsInterleaved = (userInputSampleFormat & paNonInterleaved)?0:1;
		
        bp->hostInputIsInterleaved = (hostInputSampleFormat & paNonInterleaved)?0:1;

        bp->userInputSampleFormatIsEqualToHost = ((userInputSampleFormat & ~paNonInterleaved) == (hostInputSampleFormat & ~paNonInterleaved));

        tempInputBufferSize =
            bp->framesPerTempBuffer * bp->bytesPerUserInputSample * inputChannelCount;
         
        bp->tempInputBuffer = PaUtil_AllocateMemory( tempInputBufferSize );
        if( bp->tempInputBuffer == 0 )
        {
            result = paInsufficientMemory;
            goto error;
        }
        
        if( bp->framesInTempInputBuffer > 0 )
            memset( bp->tempInputBuffer, 0, tempInputBufferSize );

        if( userInputSampleFormat & paNonInterleaved )
        {
            bp->tempInputBufferPtrs =
                (void **)PaUtil_AllocateMemory( sizeof(void*)*inputChannelCount );
            if( bp->tempInputBufferPtrs == 0 )
            {
                result = paInsufficientMemory;
                goto error;
            }
        }

        bp->hostInputChannels[0] = (PaUtilChannelDescriptor*)
                PaUtil_AllocateMemory( sizeof(PaUtilChannelDescriptor) * inputChannelCount * 2);
        if( bp->hostInputChannels[0] == 0 )
        {
            result = paInsufficientMemory;
            goto error;
        }

        bp->hostInputChannels[1] = &bp->hostInputChannels[0][inputChannelCount];
    }

    if( outputChannelCount > 0 )
    {
        bytesPerSample = Pa_GetSampleSize( hostOutputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerHostOutputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        bytesPerSample = Pa_GetSampleSize( userOutputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerUserOutputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        bp->outputConverter =
            PaUtil_SelectConverter( userOutputSampleFormat, hostOutputSampleFormat, streamFlags );

        bp->outputZeroer = PaUtil_SelectZeroer( hostOutputSampleFormat );

        bp->userOutputIsInterleaved = (userOutputSampleFormat & paNonInterleaved)?0:1;

        bp->hostOutputIsInterleaved = (hostOutputSampleFormat & paNonInterleaved)?0:1;

        bp->userOutputSampleFormatIsEqualToHost = ((userOutputSampleFormat & ~paNonInterleaved) == (hostOutputSampleFormat & ~paNonInterleaved));

        tempOutputBufferSize =
                bp->framesPerTempBuffer * bp->bytesPerUserOutputSample * outputChannelCount;

        bp->tempOutputBuffer = PaUtil_AllocateMemory( tempOutputBufferSize );
        if( bp->tempOutputBuffer == 0 )
        {
            result = paInsufficientMemory;
            goto error;
        }

        if( bp->framesInTempOutputBuffer > 0 )
            memset( bp->tempOutputBuffer, 0, tempOutputBufferSize );
        
        if( userOutputSampleFormat & paNonInterleaved )
        {
            bp->tempOutputBufferPtrs =
                (void **)PaUtil_AllocateMemory( sizeof(void*)*outputChannelCount );
            if( bp->tempOutputBufferPtrs == 0 )
            {
                result = paInsufficientMemory;
                goto error;
            }
        }

        bp->hostOutputChannels[0] = (PaUtilChannelDescriptor*)
                PaUtil_AllocateMemory( sizeof(PaUtilChannelDescriptor)*outputChannelCount * 2 );
        if( bp->hostOutputChannels[0] == 0 )
        {                                                                     
            result = paInsufficientMemory;
            goto error;
        }

        bp->hostOutputChannels[1] = &bp->hostOutputChannels[0][outputChannelCount];
    }

    PaUtil_InitializeTriangularDitherState( &bp->ditherGenerator );

    bp->samplePeriod = 1. / sampleRate;

    bp->streamCallback = streamCallback;
    bp->userData = userData;

    return result;

error:
    if( bp->tempInputBuffer )
        PaUtil_FreeMemory( bp->tempInputBuffer );

    if( bp->tempInputBufferPtrs )
        PaUtil_FreeMemory( bp->tempInputBufferPtrs );

    if( bp->hostInputChannels[0] )
        PaUtil_FreeMemory( bp->hostInputChannels[0] );

    if( bp->tempOutputBuffer )
        PaUtil_FreeMemory( bp->tempOutputBuffer );

    if( bp->tempOutputBufferPtrs )
        PaUtil_FreeMemory( bp->tempOutputBufferPtrs );

    if( bp->hostOutputChannels[0] )
        PaUtil_FreeMemory( bp->hostOutputChannels[0] );

    return result;
}